

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O3

int av1_txfm_uvrd(AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,BLOCK_SIZE bsize,
                 int64_t ref_best_rd)

{
  byte bVar1;
  ushort uVar2;
  long lVar3;
  bool bVar4;
  MB_MODE_INFO *pMVar5;
  long lVar6;
  byte tx_size;
  long lVar7;
  int plane;
  int iVar8;
  long lVar9;
  long lVar10;
  BLOCK_SIZE plane_bsize;
  bool bVar11;
  int *local_70;
  int *local_68;
  RD_STATS this_rd_stats;
  
  rd_stats->rate = 0;
  rd_stats->zero_rate = 0;
  rd_stats->dist = 0;
  rd_stats->rdcost = 0;
  rd_stats->sse = 0;
  rd_stats->skip_txfm = '\x01';
  if (ref_best_rd < 0) {
    return 0;
  }
  if ((x->e_mbd).is_chroma_ref != true) {
    return 1;
  }
  pMVar5 = *(x->e_mbd).mi;
  uVar2 = *(ushort *)&pMVar5->field_0xa7;
  if ((char)uVar2 < '\0') {
    plane_bsize = av1_ss_size_lookup[bsize][(x->e_mbd).plane[1].subsampling_x]
                  [(x->e_mbd).plane[1].subsampling_y];
LAB_00aa2a5d:
    iVar8 = 1;
    do {
      av1_subtract_plane(x,plane_bsize,iVar8);
      iVar8 = iVar8 + 1;
    } while (iVar8 != 3);
    pMVar5 = *(x->e_mbd).mi;
    uVar2 = *(ushort *)&pMVar5->field_0xa7;
    bVar4 = true;
  }
  else {
    plane_bsize = av1_ss_size_lookup[bsize][(x->e_mbd).plane[1].subsampling_x]
                  [(x->e_mbd).plane[1].subsampling_y];
    if ('\0' < pMVar5->ref_frame[0]) goto LAB_00aa2a5d;
    bVar4 = false;
  }
  local_68 = &(x->e_mbd).plane[1].subsampling_x;
  local_70 = &(x->e_mbd).plane[1].subsampling_y;
  lVar9 = 0;
  tx_size = 0;
  if ((x->e_mbd).lossless[uVar2 & 7] != 0) goto LAB_00aa2ab0;
  bVar1 = ""[av1_ss_size_lookup[pMVar5->bsize][*local_68][*local_70]];
  if (bVar1 < 0x11) {
    tx_size = 3;
    if ((bVar1 - 0xb < 2) || (bVar1 == 4)) goto LAB_00aa2ab0;
  }
  else {
    if (bVar1 == 0x11) {
      tx_size = 9;
      goto LAB_00aa2ab0;
    }
    if (bVar1 == 0x12) {
      tx_size = 10;
      goto LAB_00aa2ab0;
    }
  }
  tx_size = bVar1;
LAB_00aa2ab0:
  lVar7 = 0;
  lVar6 = 0;
  iVar8 = 1;
  do {
    if (lVar7 < lVar6) {
      lVar6 = lVar7;
    }
    if ((cpi->sf).inter_sf.perform_best_rd_based_gating_for_chroma == 0) {
      lVar6 = lVar9;
    }
    if (ref_best_rd == 0x7fffffffffffffff) {
      lVar6 = lVar9;
    }
    if (!bVar4) {
      lVar6 = lVar9;
    }
    av1_txfm_rd_in_plane
              (x,cpi,&this_rd_stats,ref_best_rd - lVar6,0,iVar8,plane_bsize,tx_size,'\0',0);
    if ((long)this_rd_stats.rate == 0x7fffffff) goto LAB_00aa2c0f;
    if ((long)rd_stats->rate == 0x7fffffff) {
      rd_stats->dist = 0x7fffffffffffffff;
      rd_stats->rdcost = 0x7fffffffffffffff;
      rd_stats->sse = 0x7fffffffffffffff;
      rd_stats->skip_txfm = '\0';
      rd_stats->zero_rate = 0;
      lVar10 = 0x7fffffff;
      lVar6 = -0x80;
      lVar7 = -0x80;
    }
    else {
      lVar10 = (long)rd_stats->rate + (long)this_rd_stats.rate;
      if (0x7ffffffe < lVar10) {
        lVar10 = 0x7fffffff;
      }
      rd_stats->rate = (int)lVar10;
      if (rd_stats->zero_rate == 0) {
        rd_stats->zero_rate = this_rd_stats.zero_rate;
      }
      lVar7 = rd_stats->dist + this_rd_stats.dist;
      lVar3 = rd_stats->sse;
      rd_stats->dist = lVar7;
      lVar6 = 0x7fffffffffffffff;
      if ((lVar3 != 0x7fffffffffffffff) && (lVar6 = lVar3, this_rd_stats.sse != 0x7fffffffffffffff))
      {
        rd_stats->sse = this_rd_stats.sse + lVar3;
        lVar6 = this_rd_stats.sse + lVar3;
      }
      rd_stats->skip_txfm = rd_stats->skip_txfm & this_rd_stats.skip_txfm;
      lVar10 = (long)(int)lVar10;
      lVar7 = lVar7 * 0x80;
      lVar6 = lVar6 << 7;
    }
    lVar7 = (x->rdmult * lVar10 + 0x100 >> 9) + lVar7;
    lVar10 = lVar6;
    if (lVar7 < lVar6) {
      lVar10 = lVar7;
    }
  } while ((lVar10 <= ref_best_rd) && (bVar11 = iVar8 != 2, iVar8 = iVar8 + 1, bVar11));
  iVar8 = 1;
  if (ref_best_rd < lVar10) {
LAB_00aa2c0f:
    rd_stats->rate = 0x7fffffff;
    rd_stats->zero_rate = 0;
    rd_stats->dist = 0x7fffffffffffffff;
    rd_stats->rdcost = 0x7fffffffffffffff;
    rd_stats->sse = 0x7fffffffffffffff;
    rd_stats->skip_txfm = '\0';
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int av1_txfm_uvrd(const AV1_COMP *const cpi, MACROBLOCK *x, RD_STATS *rd_stats,
                  BLOCK_SIZE bsize, int64_t ref_best_rd) {
  av1_init_rd_stats(rd_stats);
  if (ref_best_rd < 0) return 0;
  if (!x->e_mbd.is_chroma_ref) return 1;

  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_U];
  const int is_inter = is_inter_block(mbmi);
  int64_t this_rd = 0, skip_txfm_rd = 0;
  const BLOCK_SIZE plane_bsize =
      get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);

  if (is_inter) {
    for (int plane = 1; plane < MAX_MB_PLANE; ++plane)
      av1_subtract_plane(x, plane_bsize, plane);
  }

  const int skip_trellis = 0;
  const TX_SIZE uv_tx_size = av1_get_tx_size(AOM_PLANE_U, xd);
  int is_cost_valid = 1;
  for (int plane = 1; plane < MAX_MB_PLANE; ++plane) {
    RD_STATS this_rd_stats;
    int64_t chroma_ref_best_rd = ref_best_rd;
    // For inter blocks, refined ref_best_rd is used for early exit
    // For intra blocks, even though current rd crosses ref_best_rd, early
    // exit is not recommended as current rd is used for gating subsequent
    // modes as well (say, for angular modes)
    // TODO(any): Extend the early exit mechanism for intra modes as well
    if (cpi->sf.inter_sf.perform_best_rd_based_gating_for_chroma && is_inter &&
        chroma_ref_best_rd != INT64_MAX)
      chroma_ref_best_rd = ref_best_rd - AOMMIN(this_rd, skip_txfm_rd);
    av1_txfm_rd_in_plane(x, cpi, &this_rd_stats, chroma_ref_best_rd, 0, plane,
                         plane_bsize, uv_tx_size, FTXS_NONE, skip_trellis);
    if (this_rd_stats.rate == INT_MAX) {
      is_cost_valid = 0;
      break;
    }
    av1_merge_rd_stats(rd_stats, &this_rd_stats);
    this_rd = RDCOST(x->rdmult, rd_stats->rate, rd_stats->dist);
    skip_txfm_rd = RDCOST(x->rdmult, 0, rd_stats->sse);
    if (AOMMIN(this_rd, skip_txfm_rd) > ref_best_rd) {
      is_cost_valid = 0;
      break;
    }
  }

  if (!is_cost_valid) {
    // reset cost value
    av1_invalid_rd_stats(rd_stats);
  }

  return is_cost_valid;
}